

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmm.c
# Opt level: O3

int stmm_lookup(stmm_table *table,char *key,char **value)

{
  stmm_table_entry **ppsVar1;
  stmm_hash_func_type p_Var2;
  stmm_compare_func_type p_Var3;
  int iVar4;
  int iVar5;
  stmm_table_entry *psVar6;
  stmm_table_entry **ppsVar7;
  
  p_Var2 = table->hash;
  if (p_Var2 == stmm_ptrhash) {
    iVar4 = (int)(((ulong)key >> 2) % (ulong)(long)table->num_bins);
  }
  else if (p_Var2 == stmm_numhash) {
    iVar5 = (int)key;
    iVar4 = -iVar5;
    if (0 < iVar5) {
      iVar4 = iVar5;
    }
    iVar4 = iVar4 % table->num_bins;
  }
  else {
    iVar4 = (*p_Var2)(key,table->num_bins);
  }
  psVar6 = table->bins[iVar4];
  if (psVar6 != (stmm_table_entry *)0x0) {
    ppsVar7 = table->bins + iVar4;
    do {
      p_Var3 = table->compare;
      if (p_Var3 == stmm_numcmp || p_Var3 == stmm_ptrcmp) {
        if (psVar6->key == key) {
LAB_004a013e:
          if (table->reorder_flag != 0) {
            *ppsVar7 = psVar6->next;
            ppsVar7 = table->bins;
            psVar6->next = ppsVar7[iVar4];
            ppsVar7[iVar4] = psVar6;
          }
          if (value != (char **)0x0) {
            *value = psVar6->record;
            return 1;
          }
          return 1;
        }
      }
      else {
        iVar5 = (*p_Var3)(key,psVar6->key);
        if (iVar5 == 0) goto LAB_004a013e;
      }
      ppsVar1 = &psVar6->next;
      ppsVar7 = &psVar6->next;
      psVar6 = *ppsVar1;
    } while (*ppsVar1 != (stmm_table_entry *)0x0);
  }
  return 0;
}

Assistant:

int
stmm_lookup (stmm_table *table, char *key, char **value)
{
    int hash_val;
    stmm_table_entry *ptr, **last;

    hash_val = do_hash (key, table);

    FIND_ENTRY (table, hash_val, key, ptr, last);

    if (ptr == NULL) {
    return 0;
    }
    else {
    if (value != NULL)
    {
        *value = ptr->record;
    }
    return 1;
    }
}